

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

string * __thiscall
vkt::SpirVAssembly::getTestName_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType from,IntegerType to)

{
  IntegerType type;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  getTypeName_abi_cxx11_(&local_38,this,from);
  std::operator+(&local_58,&local_38,"_to_");
  getTypeName_abi_cxx11_(&sStack_78,(SpirVAssembly *)(ulong)from,type);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

const string getTestName (IntegerType from, IntegerType to)
{
	return getTypeName(from) + "_to_" + getTypeName(to);
}